

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMK.cpp
# Opt level: O0

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::DMK::get_track_at_position(DMK *this,Address address)

{
  uint16_t uVar1;
  long offset;
  reference pvVar2;
  pointer pEVar3;
  byte *pbVar4;
  reference pvVar5;
  size_t in_RCX;
  Address in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  bool is_double_density_00;
  shared_ptr<Storage::Disk::Track> sVar6;
  byte local_1a9;
  vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> local_178;
  byte local_15d;
  int sector_size;
  value_type vStack_156;
  uint8_t next_byte;
  int c_1;
  long lStack_150;
  uint8_t header [6];
  size_t step_rate;
  undefined1 local_139;
  bool next_is_double_density;
  ulong local_130;
  size_t destination;
  size_t track_pointer;
  size_t track_length;
  size_t idam_pointer;
  unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
  local_f8;
  unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
  encoder;
  vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> segments;
  undefined1 local_d0 [7];
  bool is_double_density;
  vector<unsigned_char,_std::allocator<unsigned_char>_> track;
  size_t c;
  size_t idam_count;
  uint16_t idam_locations [64];
  DMK *this_local;
  Address address_local;
  
  offset = get_file_offset_for_position((DMK *)address,in_RDX);
  FileHolder::seek((FileHolder *)((long)address + 8),offset,0);
  c = 0;
  for (track.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      track.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage < (pointer)0x40;
      track.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           track.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) {
    uVar1 = FileHolder::get16le((FileHolder *)((long)address + 8));
    in_RCX = CONCAT62((int6)(in_RCX >> 0x10),uVar1);
    idam_locations[c - 4] = uVar1;
    if (0x7f < (idam_locations[c - 4] & 0x7fff)) {
      c = c + 1;
    }
  }
  FileHolder::read((FileHolder *)local_d0,address.head + 8,
                   (void *)(*(long *)((long)address + 0x100) + -0x80),in_RCX);
  segments.super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
       (bool)(~*(byte *)((long)address + 0x108) & 1);
  std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::vector
            ((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *)
             &encoder);
  std::
  unique_ptr<Storage::Encodings::MFM::Encoder,std::default_delete<Storage::Encodings::MFM::Encoder>>
  ::unique_ptr<std::default_delete<Storage::Encodings::MFM::Encoder>,void>
            ((unique_ptr<Storage::Encodings::MFM::Encoder,std::default_delete<Storage::Encodings::MFM::Encoder>>
              *)&local_f8);
  std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::emplace_back<>
            ((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *)
             &encoder);
  pvVar2 = std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::back
                     ((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
                       *)&encoder);
  anon_unknown.dwarf_ee8c38::new_encoder
            ((anon_unknown_dwarf_ee8c38 *)&idam_pointer,pvVar2,
             segments.
             super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_);
  std::
  unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
  ::operator=(&local_f8,
              (unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
               *)&idam_pointer);
  std::
  unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
  ::~unique_ptr((unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
                 *)&idam_pointer);
  track_length = 0;
  track_pointer = *(long *)((long)address + 0x100) - 0x80;
  destination = 0;
  while (destination < track_pointer) {
    if (track_length == c) {
      local_130 = track_pointer;
    }
    else {
      local_130 = (ulong)(int)((idam_locations[track_length - 4] & 0x7fff) - 0x80);
    }
    if ((segments.
         super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ == false) &&
       ((*(byte *)((long)address + 0x108) & 1) == 0)) {
      segments.
      super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = true;
      std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::
      emplace_back<>((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
                      *)&encoder);
      pvVar2 = std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::
               back((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *
                    )&encoder);
      anon_unknown.dwarf_ee8c38::new_encoder
                ((anon_unknown_dwarf_ee8c38 *)&stack0xfffffffffffffec8,pvVar2,true);
      std::
      unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
      ::operator=(&local_f8,
                  (unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
                   *)&stack0xfffffffffffffec8);
      std::
      unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
      ::~unique_ptr((unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
                     *)&stack0xfffffffffffffec8);
    }
    for (; destination < local_130; destination = destination + 1) {
      pEVar3 = std::
               unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
               ::operator->(&local_f8);
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,
                          destination);
      (*pEVar3->_vptr_Encoder[3])(pEVar3,(ulong)*pbVar4,0);
    }
    if (local_130 == track_pointer) break;
    is_double_density_00 = (idam_locations[track_length - 4] & 0x8000) != 0;
    local_139 = is_double_density_00;
    if (is_double_density_00 !=
        segments.
        super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_) {
      std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::
      emplace_back<>((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
                      *)&encoder);
      pvVar2 = std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::
               back((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *
                    )&encoder);
      anon_unknown.dwarf_ee8c38::new_encoder
                ((anon_unknown_dwarf_ee8c38 *)&step_rate,pvVar2,is_double_density_00);
      std::
      unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
      ::operator=(&local_f8,
                  (unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
                   *)&step_rate);
      std::
      unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
      ::~unique_ptr((unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
                     *)&step_rate);
      segments.
      super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = is_double_density_00;
    }
    local_1a9 = 0;
    if (segments.
        super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ == false) {
      local_1a9 = *(byte *)((long)address + 0x108) ^ 0xff;
    }
    lStack_150 = (ulong)(local_1a9 & 1) + 1;
    pEVar3 = std::
             unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
             ::operator->(&local_f8);
    (*pEVar3->_vptr_Encoder[5])();
    for (sector_size = 0; sector_size < 6; sector_size = sector_size + 1) {
      destination = destination + lStack_150;
      pEVar3 = std::
               unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
               ::operator->(&local_f8);
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,
                          destination);
      (*pEVar3->_vptr_Encoder[3])(pEVar3,(ulong)*pbVar4,0);
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,
                          destination);
      (&vStack_156)[sector_size] = *pvVar5;
    }
    destination = lStack_150 + destination;
    while( true ) {
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,
                          destination);
      local_15d = *pbVar4;
      destination = lStack_150 + destination;
      if ((local_15d == 0xfb) || (local_15d == 0xf8)) break;
      pEVar3 = std::
               unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
               ::operator->(&local_f8);
      (*pEVar3->_vptr_Encoder[3])(pEVar3,(ulong)local_15d,0);
    }
    if (local_15d == 0xfb) {
      pEVar3 = std::
               unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
               ::operator->(&local_f8);
      (*pEVar3->_vptr_Encoder[6])();
    }
    else {
      pEVar3 = std::
               unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
               ::operator->(&local_f8);
      (*pEVar3->_vptr_Encoder[7])();
    }
    pEVar3 = std::
             unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
             ::operator->(&local_f8);
    (*pEVar3->_vptr_Encoder[6])();
    local_178.
    super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (0x80 << (c_1._1_1_ & 0x1f)) + 2;
    while (local_178.
           super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
      local_178.
      super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           local_178.
           super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1;
      pEVar3 = std::
               unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
               ::operator->(&local_f8);
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,
                          destination);
      (*pEVar3->_vptr_Encoder[3])(pEVar3,(ulong)*pbVar4,0);
      destination = lStack_150 + destination;
    }
    track_length = track_length + 1;
    local_178.
    super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         local_178.
         super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1;
  }
  std::
  make_shared<Storage::Disk::PCMTrack,std::vector<Storage::Disk::PCMSegment,std::allocator<Storage::Disk::PCMSegment>>&>
            (&local_178);
  std::shared_ptr<Storage::Disk::Track>::shared_ptr<Storage::Disk::PCMTrack,void>
            ((shared_ptr<Storage::Disk::Track> *)this,
             (shared_ptr<Storage::Disk::PCMTrack> *)&local_178);
  std::shared_ptr<Storage::Disk::PCMTrack>::~shared_ptr
            ((shared_ptr<Storage::Disk::PCMTrack> *)&local_178);
  std::
  unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
  ::~unique_ptr(&local_f8);
  std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::~vector
            ((vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *)
             &encoder);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
  sVar6.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar6.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Disk::Track>)
         sVar6.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<::Storage::Disk::Track> DMK::get_track_at_position(::Storage::Disk::Track::Address address) {
	file_.seek(get_file_offset_for_position(address), SEEK_SET);

	// Read the IDAM table.
	uint16_t idam_locations[64];
	std::size_t idam_count = 0;
	for(std::size_t c = 0; c < sizeof(idam_locations) / sizeof(*idam_locations); ++c) {
		idam_locations[idam_count] = file_.get16le();
		if((idam_locations[idam_count] & 0x7fff) >= 128) {
			idam_count++;
		}
	}

	// Grab the rest of the track.
	std::vector<uint8_t> track = file_.read(size_t(track_length_ - 0x80));

	// Default to outputting double density unless the disk doesn't support it.
	bool is_double_density = !is_purely_single_density_;
	std::vector<PCMSegment> segments;
	std::unique_ptr<Encodings::MFM::Encoder> encoder;
	segments.emplace_back();
	encoder = new_encoder(segments.back(), is_double_density);

	std::size_t idam_pointer = 0;

	const std::size_t track_length = size_t(track_length_) - 0x80;
	std::size_t track_pointer = 0;
	while(track_pointer < track_length) {
		// Determine bytes left until next IDAM.
		std::size_t destination;
		if(idam_pointer != idam_count) {
			destination = (idam_locations[idam_pointer] & 0x7fff) - 0x80;
		} else {
			destination = track_length;
		}

		// Output every intermediate byte.
		if(!is_double_density && !is_purely_single_density_) {
			is_double_density = true;
			segments.emplace_back();
			encoder = new_encoder(segments.back(), is_double_density);
		}
		while(track_pointer < destination) {
			encoder->add_byte(track[track_pointer]);
			track_pointer++;
		}

		// Exit now if that's it.
		if(destination == track_length) break;

		// Being now located at the IDAM, check for a change of encoding.
		bool next_is_double_density = !!(idam_locations[idam_pointer] & 0x8000);
		if(next_is_double_density != is_double_density) {
			is_double_density = next_is_double_density;
			segments.emplace_back();
			encoder = new_encoder(segments.back(), is_double_density);
		}

		// Now at the IDAM, which will always be an FE regardless of FM/MFM encoding,
		// presumably through misunderstanding of the designer? Write out a real IDAM
		// for the current density, then the rest of the ID: four bytes for the address
		// plus two for the CRC. Keep a copy of the header while we're here, so that the
		// size of the sector is known momentarily.
		std::size_t step_rate = (!is_double_density && !is_purely_single_density_) ? 2 : 1;
		encoder->add_ID_address_mark();
		uint8_t header[6];
		for(int c = 0; c < 6; ++c) {
			track_pointer += step_rate;
			encoder->add_byte(track[track_pointer]);
			header[c] = track[track_pointer];
		}
		track_pointer += step_rate;

		// Now write out as many bytes as are found prior to an FB or F8 (same comment as
		// above: those are the FM-esque marks, but it seems as though transcription to MFM
		// is implicit).
		while(true) {
			uint8_t next_byte = track[track_pointer];
			track_pointer += step_rate;
			if(next_byte == 0xfb || next_byte == 0xf8) {
				// Write a data or deleted data address mark.
				if(next_byte == 0xfb) encoder->add_data_address_mark();
				else encoder->add_deleted_data_address_mark();
				break;
			}
			encoder->add_byte(next_byte);
		}

		// Now write out a data mark (the file format appears to leave these implicit?),
		// then the sector contents plus the CRC.
		encoder->add_data_address_mark();
		int sector_size = 2 + (128 << header[3]);
		while(sector_size--) {
			encoder->add_byte(track[track_pointer]);
			track_pointer += step_rate;
		}

		idam_pointer++;
	}

	return std::make_shared<PCMTrack>(segments);
}